

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorLink.c
# Opt level: O0

int ExorLinkCubeIteratorStart(Cube **pGroup,Cube *pC1,Cube *pC2,cubedist Dist)

{
  byte bVar1;
  int iVar2;
  Cube *pCVar3;
  int local_38;
  int local_34;
  int local_30;
  int c;
  int i;
  cubedist Dist_local;
  Cube *pC2_local;
  Cube *pC1_local;
  Cube **pGroup_local;
  
  if (pC1 == (Cube *)0x0) {
    __assert_fail("pC1 != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exorLink.c"
                  ,0x180,"int ExorLinkCubeIteratorStart(Cube **, Cube *, Cube *, cubedist)");
  }
  if (pC2 == (Cube *)0x0) {
    __assert_fail("pC2 != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exorLink.c"
                  ,0x181,"int ExorLinkCubeIteratorStart(Cube **, Cube *, Cube *, cubedist)");
  }
  if (fWorking != 0) {
    __assert_fail("!fWorking",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exorLink.c"
                  ,0x182,"int ExorLinkCubeIteratorStart(Cube **, Cube *, Cube *, cubedist)");
  }
  nCubes = Dist + DIST4;
  nCubesInGroup = s_ELnCubes[(int)Dist];
  nGroups = s_ELnGroups[Dist];
  nDist = Dist;
  pCA = pC1;
  pCB = pC2;
  nDifferentVars = FindDiffVars(DiffVars,pC1,pC2);
  if (nCubes == nDifferentVars) {
    for (local_30 = 0; local_30 < g_CoverInfo.nWordsIn; local_30 = local_30 + 1) {
      DammyBitData[local_30] = pCA->pCubeDataIn[local_30];
    }
    if (DiffVars[0] < 0) {
      local_38 = nCubes + -1;
    }
    else {
      local_38 = nCubes;
    }
    nDiffVarsIn = local_38;
    pDiffVars = DiffVars + 1;
    if (-1 < DiffVars[0]) {
      pDiffVars = DiffVars;
    }
    for (local_30 = 0; local_30 < nDiffVarsIn; local_30 = local_30 + 1) {
      DiffVarWords[local_30] = (pDiffVars[local_30] << 1) >> 5;
      DiffVarBits[local_30] = (pDiffVars[local_30] & 0xfU) << 1;
      DammyBitData[DiffVarWords[local_30]] =
           (3 << ((byte)DiffVarBits[local_30] & 0x1f) ^ 0xffffffffU) &
           DammyBitData[DiffVarWords[local_30]];
    }
    MaskLiterals = 0;
    StartingLiterals = (int)pCA->a;
    BitShift = 0;
    for (local_30 = 0; local_30 < nDiffVarsIn; local_30 = local_30 + 1) {
      DiffVarValues[local_30][0] =
           pCA->pCubeDataIn[DiffVarWords[local_30]] >> ((byte)DiffVarBits[local_30] & 0x1f) & 3;
      if (DiffVarValues[local_30][0] != 3) {
        MaskLiterals = 1 << ((byte)BitShift & 0x1f) | MaskLiterals;
        StartingLiterals = StartingLiterals + -1;
      }
      BitShift = BitShift + 1;
      DiffVarValues[local_30][1] =
           pCB->pCubeDataIn[DiffVarWords[local_30]] >> ((byte)DiffVarBits[local_30] & 0x1f) & 3;
      if (DiffVarValues[local_30][1] != 3) {
        MaskLiterals = 1 << ((byte)BitShift & 0x1f) | MaskLiterals;
      }
      BitShift = BitShift + 1;
      DiffVarValues[local_30][2] = DiffVarValues[local_30][0] ^ DiffVarValues[local_30][1];
      if (DiffVarValues[local_30][2] != 3) {
        MaskLiterals = 1 << ((byte)BitShift & 0x1f) | MaskLiterals;
      }
      BitShift = BitShift + 2;
    }
    for (local_30 = 0; local_30 < nCubesInGroup; local_30 = local_30 + 1) {
      CubeLiterals[local_30] = (uint)BitCount[MaskLiterals & s_CubeLitMasks[Dist][local_30]];
    }
    for (local_30 = 0; local_30 < nGroups; local_30 = local_30 + 1) {
      GroupCosts[local_30] = 0;
      for (local_34 = 0; local_34 < nCubes; local_34 = local_34 + 1) {
        GroupCosts[local_30] =
             CubeLiterals[s_ELGroupRules[Dist][local_30][local_34]] + GroupCosts[local_30];
      }
    }
    if (fMinLitGroupsFirst[Dist] == 0) {
      GroupCostBest = -1;
      for (local_30 = 0; local_30 < nGroups; local_30 = local_30 + 1) {
        if (GroupCostBest < GroupCosts[local_30]) {
          GroupCostBest = GroupCosts[local_30];
          GroupCostBestNum = local_30;
        }
      }
    }
    else {
      GroupCostBest = 1000000;
      for (local_30 = 0; local_30 < nGroups; local_30 = local_30 + 1) {
        if (GroupCosts[local_30] < GroupCostBest) {
          GroupCostBest = GroupCosts[local_30];
          GroupCostBestNum = local_30;
        }
      }
    }
    LastGroup = 0;
    for (local_34 = 0; local_34 < nCubes; local_34 = local_34 + 1) {
      CubeNum = s_ELGroupRules[Dist][GroupCostBestNum][local_34];
      LastGroup = s_BitMasks[CubeNum] | LastGroup;
      pCVar3 = GetFreeCube();
      ELCubes[CubeNum] = pCVar3;
      for (local_30 = 0; local_30 < g_CoverInfo.nWordsIn; local_30 = local_30 + 1) {
        ELCubes[CubeNum]->pCubeDataIn[local_30] = DammyBitData[local_30];
      }
      NewZ = 0;
      if (DiffVars[0] < 0) {
        Value = s_ELCubeRules[Dist][CubeNum][nDiffVarsIn];
        if (Value == 0) {
          for (local_30 = 0; local_30 < g_CoverInfo.nWordsOut; local_30 = local_30 + 1) {
            Temp = pCA->pCubeDataOut[local_30];
            ELCubes[CubeNum]->pCubeDataOut[local_30] = Temp;
            NewZ = (uint)BitCount[Temp & 0xffff] + (uint)BitCount[Temp >> 0x10] + NewZ;
          }
        }
        else if (Value == 1) {
          for (local_30 = 0; local_30 < g_CoverInfo.nWordsOut; local_30 = local_30 + 1) {
            Temp = pCB->pCubeDataOut[local_30];
            ELCubes[CubeNum]->pCubeDataOut[local_30] = Temp;
            NewZ = (uint)BitCount[Temp & 0xffff] + (uint)BitCount[Temp >> 0x10] + NewZ;
          }
        }
        else if (Value == 2) {
          for (local_30 = 0; local_30 < g_CoverInfo.nWordsOut; local_30 = local_30 + 1) {
            Temp = pCA->pCubeDataOut[local_30] ^ pCB->pCubeDataOut[local_30];
            ELCubes[CubeNum]->pCubeDataOut[local_30] = Temp;
            NewZ = (uint)BitCount[Temp & 0xffff] + (uint)BitCount[Temp >> 0x10] + NewZ;
          }
        }
      }
      else {
        for (local_30 = 0; local_30 < g_CoverInfo.nWordsOut; local_30 = local_30 + 1) {
          ELCubes[CubeNum]->pCubeDataOut[local_30] = pCA->pCubeDataOut[local_30];
        }
        NewZ = (int)pCA->z;
      }
      for (local_30 = 0; local_30 < nDiffVarsIn; local_30 = local_30 + 1) {
        Value = DiffVarValues[local_30][s_ELCubeRules[Dist][CubeNum][local_30]];
        ELCubes[CubeNum]->pCubeDataIn[DiffVarWords[local_30]] =
             Value << ((byte)DiffVarBits[local_30] & 0x1f) |
             ELCubes[CubeNum]->pCubeDataIn[DiffVarWords[local_30]];
      }
      ELCubes[CubeNum]->a = (short)StartingLiterals + (short)CubeLiterals[CubeNum];
      ELCubes[CubeNum]->z = (short)NewZ;
      iVar2 = ComputeQCostBits(ELCubes[CubeNum]);
      ELCubes[CubeNum]->q = (short)iVar2;
      bVar1 = (byte)g_CoverInfo.cIDs;
      g_CoverInfo.cIDs = g_CoverInfo.cIDs + 1;
      ELCubes[CubeNum]->ID = bVar1;
      if (g_CoverInfo.cIDs == 0x100) {
        g_CoverInfo.cIDs = 1;
      }
      pGroup[local_34] = ELCubes[CubeNum];
    }
    VisitedGroups = s_BitMasks[GroupCostBestNum] | VisitedGroups;
    GroupOrder[0] = GroupCostBestNum;
    nVisitedGroups = 1;
    fWorking = 1;
    pGroup_local._4_4_ = 1;
  }
  else {
    fWorking = 0;
    pGroup_local._4_4_ = 0;
  }
  return pGroup_local._4_4_;
}

Assistant:

int ExorLinkCubeIteratorStart( Cube** pGroup, Cube* pC1, Cube* pC2, cubedist Dist )
// this function starts the Exor-Link iterator, which iterates
// through the cube groups starting from the group with min literals
// returns 1 on success, returns 0 if the cubes have wrong distance
{
    int i, c;

    // check that everything is okey
    assert( pC1 != NULL );
    assert( pC2 != NULL );
    assert( !fWorking );

    nDist = Dist;
    nCubes = Dist + 2;
    nCubesInGroup = s_ELnCubes[nDist];
    nGroups = s_ELnGroups[Dist];
    pCA = pC1;
    pCB = pC2;
    // find what variables are different in these two cubes
    // FindDiffVars returns DiffVars[0] < 0, if the output is different
    nDifferentVars = FindDiffVars( DiffVars, pCA, pCB );
    if ( nCubes != nDifferentVars )
    {
//      cout << "ExorLinkCubeIterator(): Distance mismatch";
//      cout << " nCubes = " << nCubes << " nDiffVars = " << nDifferentVars << endl;
        fWorking = 0;
        return 0;
    }

    // copy the input variable cube data into DammyBitData[]
    for ( i = 0; i < g_CoverInfo.nWordsIn; i++ )
        DammyBitData[i] = pCA->pCubeDataIn[i];

    // find the number of different input variables
    nDiffVarsIn = ( DiffVars[0] >= 0 )? nCubes: nCubes-1;
    // assign the pointer to the place where the number of diff input vars is stored
    pDiffVars   = ( DiffVars[0] >= 0 )? DiffVars: DiffVars+1;
    // find the bit offsets and remove different variables
    for ( i = 0; i < nDiffVarsIn; i++ )
    {
        DiffVarWords[i] = ((2*pDiffVars[i]) >> LOGBPI) ;
        DiffVarBits[i]  = ((2*pDiffVars[i]) & BPIMASK);
        // clear this position
        DammyBitData[ DiffVarWords[i] ] &= ~( 3 << DiffVarBits[i] );
    }

    // extract the values from the cubes and create the mask of literals
    MaskLiterals = 0;
    // initialize the base for literal counts
    StartingLiterals = pCA->a;
    for ( i = 0, BitShift = 0; i < nDiffVarsIn; i++, BitShift++ )
    {
        DiffVarValues[i][0] = ( pCA->pCubeDataIn[DiffVarWords[i]] >> DiffVarBits[i] ) & 3;
        if ( DiffVarValues[i][0] != VAR_ABS )
        {
            MaskLiterals |= ( 1 << BitShift );
            // update the base for literal counts
            StartingLiterals--;
        }
        BitShift++;

        DiffVarValues[i][1] = ( pCB->pCubeDataIn[DiffVarWords[i]] >> DiffVarBits[i] ) & 3;
        if ( DiffVarValues[i][1] != VAR_ABS )
            MaskLiterals |= ( 1 << BitShift );
        BitShift++;

        DiffVarValues[i][2] = DiffVarValues[i][0] ^ DiffVarValues[i][1];
        if ( DiffVarValues[i][2] != VAR_ABS )
            MaskLiterals |= ( 1 << BitShift );
        BitShift++;
    }

    // count the number of additional literals in each cube of the group
    for ( i = 0; i < nCubesInGroup; i++ )
        CubeLiterals[i] = BitCount[ MaskLiterals & s_CubeLitMasks[Dist][i] ];

    // compute the costs of all groups
    for ( i = 0; i < nGroups; i++ )
        // go over all cubes in the group
        for ( GroupCosts[i] = 0, c = 0; c < nCubes; c++ )
            GroupCosts[i] += CubeLiterals[ s_ELGroupRules[Dist][i][c] ];

    // find the best cost group
    if ( fMinLitGroupsFirst[Dist] ) 
    { // find the minimum cost group
        GroupCostBest = LARGE_NUM;
        for ( i = 0; i < nGroups; i++ )
            if ( GroupCostBest > GroupCosts[i] )
            {
                GroupCostBest = GroupCosts[i];
                GroupCostBestNum = i;
            }
    }
    else 
    { // find the maximum cost group
        GroupCostBest = -1;
        for ( i = 0; i < nGroups; i++ )
            if ( GroupCostBest < GroupCosts[i] )
            {
                GroupCostBest = GroupCosts[i];
                GroupCostBestNum = i;
            }
    }

    // create the cubes with min number of literals needed for the group
    LastGroup = 0;
    for ( c = 0; c < nCubes; c++ )
    {
        CubeNum = s_ELGroupRules[Dist][GroupCostBestNum][c];
        LastGroup |= s_BitMasks[CubeNum];

        // bring a cube from the free cube list
        ELCubes[CubeNum] = GetFreeCube();

        // copy the input bit data into the cube 
        for ( i = 0; i < g_CoverInfo.nWordsIn; i++ )
            ELCubes[CubeNum]->pCubeDataIn[i] = DammyBitData[i];

        // copy the output bit data into the cube
        NewZ = 0;
        if ( DiffVars[0] >= 0 ) // the output is not involved in ExorLink
        {
            for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                ELCubes[CubeNum]->pCubeDataOut[i] = pCA->pCubeDataOut[i];
            NewZ = pCA->z;
        }
        else // the output is involved
        { // determine where the output information comes from
            Value = s_ELCubeRules[Dist][CubeNum][nDiffVarsIn];
            if ( Value == vs0 )
                for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                {
                    Temp = pCA->pCubeDataOut[i];
                    ELCubes[CubeNum]->pCubeDataOut[i] = Temp;
                    NewZ += BIT_COUNT(Temp);
                }
            else if ( Value == vs1 )
                for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                {
                    Temp = pCB->pCubeDataOut[i];
                    ELCubes[CubeNum]->pCubeDataOut[i] = Temp;
                    NewZ += BIT_COUNT(Temp);
                }
            else if ( Value == vsX )
                for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                {
                    Temp = pCA->pCubeDataOut[i] ^ pCB->pCubeDataOut[i];
                    ELCubes[CubeNum]->pCubeDataOut[i] = Temp;
                    NewZ += BIT_COUNT(Temp);
                }
        }

        // set the variables that should be there
        for ( i = 0; i < nDiffVarsIn; i++ )
        {
            Value = DiffVarValues[i][ s_ELCubeRules[Dist][CubeNum][i] ];
            ELCubes[CubeNum]->pCubeDataIn[ DiffVarWords[i] ] |= ( Value << DiffVarBits[i] );
        }

        // set the number of literals
        ELCubes[CubeNum]->a = StartingLiterals + CubeLiterals[CubeNum];
        ELCubes[CubeNum]->z = NewZ;
        ELCubes[CubeNum]->q = ComputeQCostBits( ELCubes[CubeNum] );

        // assign the ID
        ELCubes[CubeNum]->ID = g_CoverInfo.cIDs++;
        // skip through zero-ID
        if ( g_CoverInfo.cIDs == 256 )
            g_CoverInfo.cIDs = 1;

        // prepare the return array
        pGroup[c] = ELCubes[CubeNum];
    }

    // mark this group as visited 
    VisitedGroups |= s_BitMasks[ GroupCostBestNum ];
    // set the first visited group number
    GroupOrder[0] = GroupCostBestNum;
    // increment the counter of visited groups
    nVisitedGroups = 1;
    fWorking = 1;
    return 1;
}